

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penalty_optimizer.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> * __thiscall
penalty_optimizer::optimize
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,penalty_optimizer *this,
          vector<float,_std::allocator<float>_> *start_parameters)

{
  ostream *poVar1;
  int iVar2;
  float fVar3;
  vector<float,_std::allocator<float>_> new_parameters;
  nelder_mead mead_optimizer;
  float local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  void *local_c0 [2];
  long local_b0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  nelder_mead local_78;
  
  nelder_mead::nelder_mead
            (&local_78,
             (int)((ulong)((long)(start_parameters->
                                 super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(start_parameters->super__Vector_base<float,_std::allocator<float>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,start_parameters);
  local_e0 = 10.0;
  iVar2 = 10;
  do {
    (*(((this->_estimator).super___shared_ptr<penalty_error_estimator,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_error_estimator)._vptr_error_estimator[3])(local_e0);
    std::vector<float,_std::allocator<float>_>::vector(&local_a8,__return_storage_ptr__);
    nelder_mead::optimize
              (&local_90,&local_78,&local_a8,
               &((this->_estimator).
                 super___shared_ptr<penalty_error_estimator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_error_estimator);
    if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    vector_utils::sub(&local_d8,__return_storage_ptr__,&local_90);
    vector_utils::abs((vector_utils *)local_c0,(int)&local_d8);
    fVar3 = vector_utils::sum((vector<float,_std::allocator<float>_> *)local_c0);
    if (local_c0[0] != (void *)0x0) {
      operator_delete(local_c0[0],local_b0 - (long)local_c0[0]);
    }
    if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<float,_std::allocator<float>_>::operator=(__return_storage_ptr__,&local_90);
    local_e0 = local_e0 * 0.1;
    if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (fVar3 < 0.0001) goto LAB_00149058;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  poVar1 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"[Penalty optimizer] Maximum number of iterations reached (",0x3a);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,").",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
LAB_00149058:
  local_78._vptr_nelder_mead = (_func_int **)&PTR__nelder_mead_001c9b48;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_78._simplex);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> penalty_optimizer::optimize(const std::vector<float>& start_parameters) const
{
  float penalty_value = 10.0f;
  const float penalty_multipler = 0.1f;

  nelder_mead mead_optimizer(start_parameters.size());

  auto current_parameters = start_parameters;
  const float acceptable_step_norm = 1e-4f;

  const int max_iterations = 10;
  int iteration = 0;

  for (; iteration < max_iterations; ++iteration)
  {
    _estimator->set_penalty_factor(penalty_value);
    auto new_parameters = mead_optimizer.optimize(current_parameters, _estimator.get());

    auto norm = vector_utils::sum(vector_utils::abs(vector_utils::sub(current_parameters, new_parameters)));
    
    current_parameters = new_parameters;

    if (norm < acceptable_step_norm)
    {
      break;
    }

    penalty_value *= penalty_multipler;
  }

  if (iteration >= max_iterations)
  {
    log_info() << "[Penalty optimizer] Maximum number of iterations reached (" << max_iterations << ")." << std::endl;
  }

  return current_parameters;
}